

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

UModelIndex * __thiscall
TreeModel::findParentOfType
          (UModelIndex *__return_storage_ptr__,TreeModel *this,UModelIndex *index,UINT8 type)

{
  bool bVar1;
  UINT8 UVar2;
  byte local_71;
  UModelIndex local_70;
  undefined1 local_58 [8];
  UModelIndex parent;
  TreeItem *item;
  UINT8 local_19;
  UModelIndex *pUStack_18;
  UINT8 type_local;
  UModelIndex *index_local;
  TreeModel *this_local;
  
  local_19 = type;
  pUStack_18 = index;
  index_local = (UModelIndex *)this;
  bVar1 = UModelIndex::isValid(index);
  local_71 = 1;
  if (bVar1) {
    UModelIndex::parent((UModelIndex *)&item,pUStack_18);
    bVar1 = UModelIndex::isValid((UModelIndex *)&item);
    local_71 = bVar1 ^ 0xff;
  }
  if ((local_71 & 1) == 0) {
    UModelIndex::parent((UModelIndex *)local_58,pUStack_18);
    parent.m = (TreeModel *)UModelIndex::internalPointer((UModelIndex *)local_58);
    while( true ) {
      bVar1 = false;
      if ((parent.m != (TreeModel *)0x0) && (bVar1 = false, (TreeItem *)parent.m != this->rootItem))
      {
        UVar2 = TreeItem::type((TreeItem *)parent.m);
        bVar1 = UVar2 != local_19;
      }
      if (!bVar1) break;
      UModelIndex::parent(&local_70,(UModelIndex *)local_58);
      local_58._0_4_ = local_70.r;
      local_58._4_4_ = local_70.c;
      parent.r = (undefined4)local_70.i;
      parent.c = local_70.i._4_4_;
      parent.i = (uint64_t)local_70.m;
      parent.m = (TreeModel *)UModelIndex::internalPointer((UModelIndex *)local_58);
    }
    if ((parent.m == (TreeModel *)0x0) || ((TreeItem *)parent.m == this->rootItem)) {
      UModelIndex::UModelIndex(__return_storage_ptr__);
    }
    else {
      __return_storage_ptr__->r = local_58._0_4_;
      __return_storage_ptr__->c = local_58._4_4_;
      __return_storage_ptr__->i = parent._0_8_;
      __return_storage_ptr__->m = (TreeModel *)parent.i;
    }
  }
  else {
    UModelIndex::UModelIndex(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::findParentOfType(const UModelIndex& index, UINT8 type) const
{
    if (!index.isValid() || !index.parent().isValid())
        return UModelIndex();
    
    TreeItem *item;
    UModelIndex parent = index.parent();
    
    for (item = static_cast<TreeItem*>(parent.internalPointer());
         item != NULL && item != rootItem && item->type() != type;
         item = static_cast<TreeItem*>(parent.internalPointer()))
        parent = parent.parent();
    if (item != NULL && item != rootItem)
        return parent;
    
    return UModelIndex();
}